

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

int Pdr_ManCountVariables(Pdr_Man_t *p,int kStart)

{
  Vec_Ptr_t *vCubes;
  Vec_Int_t *__ptr;
  long lVar1;
  int iVar2;
  
  vCubes = Pdr_ManCollectCubes(p,kStart);
  __ptr = Pdr_ManCountFlops(p,vCubes);
  if ((long)__ptr->nSize < 1) {
    iVar2 = 0;
  }
  else {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(0 < __ptr->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (__ptr->nSize != lVar1);
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
  }
  if (vCubes->pArray != (void **)0x0) {
    free(vCubes->pArray);
    vCubes->pArray = (void **)0x0;
  }
  if (vCubes != (Vec_Ptr_t *)0x0) {
    free(vCubes);
  }
  return iVar2;
}

Assistant:

int Pdr_ManCountVariables( Pdr_Man_t * p, int kStart )
{
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    int i, Entry, Counter = 0;
    vCubes = Pdr_ManCollectCubes( p, kStart );
    vFlopCounts = Pdr_ManCountFlops( p, vCubes );
    Vec_IntForEachEntry( vFlopCounts, Entry, i )
        Counter += (Entry > 0);
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    return Counter;
}